

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O0

void __thiscall qclab::qgates::RotationY<double>::RotationY(RotationY<double> *this,real_type theta)

{
  real_type theta_local;
  RotationY<double> *this_local;
  
  QRotationGate1<double>::QRotationGate1(&this->super_QRotationGate1<double>,0,theta,false);
  (this->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00757188;
  return;
}

Assistant:

RotationY( const real_type theta )
        : QRotationGate1< T >( 0 , theta )
        { }